

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
* __thiscall
phmap::priv::
btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
::erase(pair<unsigned_long,_phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>_>
        *__return_storage_ptr__,
       btree<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
       *this,iterator _begin,iterator _end)

{
  undefined1 auVar1 [12];
  bool bVar2;
  byte bVar3;
  unsigned_long uVar4;
  btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
  *this_00;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  iterator iter;
  iterator _begin_00;
  iterator iter_00;
  iterator iVar8;
  iterator _end_00;
  
  this_00 = _begin.node;
  iVar5 = _begin.position;
  uVar4 = std::
          __distance<phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,int,phmap::Less<int>,std::allocator<std::pair<int_const,int>>,256,false>>,std::pair<int_const,int>&,std::pair<int_const,int>*>>
                    (this_00,iVar5,_end.node,_end.position);
  if (-1 < (long)uVar4) {
    if (uVar4 == 0) {
      uVar4 = 0;
    }
    else {
      uVar7 = this->size_;
      uVar6 = uVar7 - uVar4;
      if (uVar6 == 0) {
        clear(this);
        iVar8 = end(this);
        this_00 = iVar8.node;
        iVar5 = iVar8.position;
      }
      else if (this_00 == _end.node) {
        auVar1 = _begin._0_12_;
        iVar8._12_4_ = 0;
        iVar8.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                      *)auVar1._0_8_;
        iVar8.position = auVar1._8_4_;
        _end_00._12_4_ = 0;
        _end_00.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                        *)SUB128(_end._0_12_,0);
        _end_00.position = SUB124(_end._0_12_,8);
        erase_same_node(this,iVar8,_end_00);
        this->size_ = this->size_ - uVar4;
        iter._12_4_ = 0;
        iter.node = (btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                     *)auVar1._0_8_;
        iter.position = auVar1._8_4_;
        iVar8 = rebalance_after_delete(this,iter);
        this_00 = iVar8.node;
        iVar5 = iVar8.position;
      }
      else {
        while (uVar6 < uVar7) {
          bVar2 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                  ::leaf(this_00);
          if (bVar2) {
            uVar7 = this->size_ - uVar6;
            bVar3 = btree_node<phmap::priv::map_params<int,_int,_phmap::Less<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_false>_>
                    ::count(this_00);
            if ((ulong)(long)(int)((uint)bVar3 - iVar5) <= uVar7) {
              uVar7 = (long)(int)((uint)bVar3 - iVar5);
            }
            _begin_00.position = iVar5;
            _begin_00.node = this_00;
            _begin_00._12_4_ = 0;
            iVar8 = erase_from_leaf_node(this,_begin_00,uVar7);
            auVar1 = iVar8._0_12_;
          }
          else {
            iter_00.position = iVar5;
            iter_00.node = this_00;
            iter_00._12_4_ = 0;
            iVar8 = erase(this,iter_00);
            auVar1 = iVar8._0_12_;
          }
          this_00 = auVar1._0_8_;
          iVar5 = auVar1._8_4_;
          uVar7 = this->size_;
        }
      }
    }
    __return_storage_ptr__->first = uVar4;
    (__return_storage_ptr__->second).node = this_00;
    (__return_storage_ptr__->second).position = iVar5;
    return __return_storage_ptr__;
  }
  __assert_fail("count >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                ,0xac4,
                "std::pair<size_type, iterator> phmap::priv::btree<phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>>::erase(iterator, iterator) [Params = phmap::priv::map_params<int, int, phmap::Less<int>, std::allocator<std::pair<const int, int>>, 256, false>]"
               );
}

Assistant:

auto btree<P>::erase(iterator _begin, iterator _end)
        -> std::pair<size_type, iterator> {
        difference_type count = std::distance(_begin, _end);
        assert(count >= 0);

        if (count == 0) {
            return {0, _begin};
        }

        if (count == (difference_type)size_) {
            clear();
            return {count, this->end()};
        }

        if (_begin.node == _end.node) {
            erase_same_node(_begin, _end);
            size_ -= count;
            return {count, rebalance_after_delete(_begin)};
        }

        const size_type target_size = size_ - count;
        while (size_ > target_size) {
            if (_begin.node->leaf()) {
                const size_type remaining_to_erase = size_ - target_size;
                const size_type remaining_in_node = _begin.node->count() - _begin.position;
                _begin = erase_from_leaf_node(
                    _begin, (std::min)(remaining_to_erase, remaining_in_node));
            } else {
                _begin = erase(_begin);
            }
        }
        return {count, _begin};
    }